

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::convertConditionalExpression
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *condition,bool mustBeScalar)

{
  TIntermediate *this_00;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  TType local_c8;
  undefined1 local_29;
  TIntermTyped *pTStack_28;
  bool mustBeScalar_local;
  TIntermTyped *condition_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  local_29 = mustBeScalar;
  pTStack_28 = condition;
  condition_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  if (mustBeScalar) {
    iVar1 = (*(condition->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 200))();
    if ((uVar2 & 1) == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,condition_local,"requires a scalar","conditional expression","");
      return (TIntermTyped *)0x0;
    }
  }
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar1 = (*(pTStack_28->super_TIntermNode)._vptr_TIntermNode[0x26])();
  TType::TType(&local_c8,EbtBool,EvqTemporary,iVar1,0,0,false);
  this_local = (HlslParseContext *)
               TIntermediate::addConversion(this_00,EOpConstructBool,&local_c8,pTStack_28);
  TType::~TType(&local_c8);
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::convertConditionalExpression(const TSourceLoc& loc, TIntermTyped* condition,
                                                             bool mustBeScalar)
{
    if (mustBeScalar && !condition->getType().isScalarOrVec1()) {
        error(loc, "requires a scalar", "conditional expression", "");
        return nullptr;
    }

    return intermediate.addConversion(EOpConstructBool, TType(EbtBool, EvqTemporary, condition->getVectorSize()),
                                      condition);
}